

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void test_simple_ggx_fit(void)

{
  ostream *poVar1;
  vec<3,_float,_(glm::precision)0> *x;
  allocator<char> local_1a9;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_1a8;
  ltc_store_data data;
  string local_180;
  ggx ggx;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_150;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_140;
  vec3 average_direction;
  brdf_plot plot;
  ltc ltc;
  
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: test_simple_ggx_fit started.");
  std::endl<char,std::char_traits<char>>(poVar1);
  ggx.super_brdf._vptr_brdf = (_func_int **)&PTR__brdf_001c48b0;
  ggx._alpha = 0.15;
  plot._size = 0;
  plot._4_4_ = 0;
  plot._brdf._0_4_ = 0x3f800000;
  local_1a8.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
        )glm::detail::compute_normalize<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                   ((vec<3,_float,_(glm::precision)0> *)&plot);
  calculate_average_terms
            ((ltc_average_terms *)&plot,&ggx.super_brdf,(vec3 *)&local_1a8.field_0,0x20);
  average_direction.field_0.field_0.z = plot._eye_position.field_0.field_0.x;
  average_direction.field_0._0_8_ = CONCAT44(plot._brdf._4_4_,plot._brdf._0_4_);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," average direction: ");
  glm::detail::compute_to_string<glm::vec<3,float,(glm::precision)0>>::call_abi_cxx11_
            ((string *)&plot,
             (compute_to_string<glm::vec<3,float,(glm::precision)0>> *)&average_direction,x);
  poVar1 = std::operator<<(poVar1,(string *)&plot);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&plot);
  local_140._0_8_ = 0x3f8000003f800000;
  local_140.field_0.z = 0.0;
  local_150._0_8_ = 0;
  local_150.field_0.z = 0.0;
  ltc_fit(&data,&ggx.super_brdf,(vec3)local_1a8.field_0,true,(vec3 *)&local_140.field_0,
          (vec3 *)&local_150.field_0);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"Store data:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," a=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,data.matrix_parameters._M_elems[0]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," b=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,data.matrix_parameters._M_elems[1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," c=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,data.matrix_parameters._M_elems[2]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," d=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,data.matrix_parameters._M_elems[3]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," e=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,data.matrix_parameters._M_elems[4]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," fresnel=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,data.fresnel_term);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1," magnitude=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,data.distribution_norm);
  std::endl<char,std::char_traits<char>>(poVar1);
  ::ltc::ltc(&ltc);
  ::ltc::set_store_data(&ltc,&data);
  brdf_plot::brdf_plot(&plot);
  brdf_plot::set_view_dir(&plot,(vec3 *)&local_1a8.field_0);
  brdf_plot::set_resolution(&plot,0x200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"test_simple_ggx_fit_ggx.png",&local_1a9);
  brdf_plot::export_png(&plot,&ggx.super_brdf,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"test_simple_ggx_fit_ltc.png",&local_1a9);
  brdf_plot::export_png(&plot,&ltc.super_brdf,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: test_simple_ggx_fit completed.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void test_simple_ggx_fit()
{
    log_info() << "VISUAL TEST: test_simple_ggx_fit started." << std::endl;

    ggx ggx;
    ggx.set_alpha(0.15f);

    auto view_dir = glm::normalize(glm::vec3{0.0f, 0.0f, 1.0f});

    auto average_direction = calculate_average_terms(ggx, view_dir).average_direction;
    log_info() << " average direction: " << glm::to_string(average_direction) << std::endl;

    glm::vec3 first_guess = glm::vec3{1.0f, 1.0f, 0.0f};
    glm::vec3 next_guess;
    auto data = ltc_fit(ggx, view_dir, true, first_guess, next_guess);

    log_info() << "Store data:" << std::endl;
    log_info() << " a=" << data.matrix_parameters[0] << std::endl;
    log_info() << " b=" << data.matrix_parameters[1] << std::endl;
    log_info() << " c=" << data.matrix_parameters[2] << std::endl;
    log_info() << " d=" << data.matrix_parameters[3] << std::endl;
    log_info() << " e=" << data.matrix_parameters[4] << std::endl;
    log_info() << " fresnel=" << data.fresnel_term << std::endl;
    log_info() << " magnitude=" << data.distribution_norm << std::endl;

    ltc ltc;
    ltc.set_store_data(data);

    brdf_plot plot;
    plot.set_view_dir(view_dir);
    plot.set_resolution(512);
    plot.export_png(&ggx, "test_simple_ggx_fit_ggx.png");
    plot.export_png(&ltc, "test_simple_ggx_fit_ltc.png");

    log_info() << "VISUAL TEST: test_simple_ggx_fit completed." << std::endl;
}